

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

int Abc_NamStrFindOrAddLim(Abc_Nam_t *p,char *pStr,char *pLim,int *pfFound)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *__dest;
  char *local_58;
  char *pStore;
  int *piPlace;
  int iHandleNew;
  int *pfFound_local;
  char *pLim_local;
  char *pStr_local;
  Abc_Nam_t *p_local;
  
  if (pLim <= pStr) {
    __assert_fail("pStr < pLim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                  ,0x1b6,"int Abc_NamStrFindOrAddLim(Abc_Nam_t *, char *, char *, int *)");
  }
  piVar3 = Abc_NamStrHashFind(p,pStr,pLim);
  if (*piVar3 == 0) {
    if (pfFound != (int *)0x0) {
      *pfFound = 0;
    }
    iVar1 = p->iHandle + ((int)pLim - (int)pStr) + 1;
    while (p->nStore < iVar1) {
      p->nStore = p->nStore * 3;
      p->nStore = p->nStore / 2;
      if (p->pStore == (char *)0x0) {
        local_58 = (char *)malloc((long)p->nStore);
      }
      else {
        local_58 = (char *)realloc(p->pStore,(long)p->nStore);
      }
      p->pStore = local_58;
    }
    if (p->nStore < iVar1) {
      __assert_fail("p->nStore >= iHandleNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                    ,0x1c7,"int Abc_NamStrFindOrAddLim(Abc_Nam_t *, char *, char *, int *)");
    }
    iVar2 = Vec_IntSize(&p->vInt2Handle);
    *piVar3 = iVar2;
    __dest = Abc_NamHandleToStr(p,p->iHandle);
    strncpy(__dest,pStr,(long)pLim - (long)pStr);
    __dest[(long)pLim - (long)pStr] = '\0';
    Vec_IntPush(&p->vInt2Handle,p->iHandle);
    Vec_IntPush(&p->vInt2Next,0);
    p->iHandle = iVar1;
    iVar1 = Vec_IntSize(&p->vInt2Handle);
    iVar2 = p->nBins * 2;
    if (iVar1 != iVar2 && SBORROW4(iVar1,iVar2) == iVar1 + p->nBins * -2 < 0) {
      Abc_NamStrHashResize(p);
    }
    iVar1 = Vec_IntSize(&p->vInt2Handle);
    p_local._4_4_ = iVar1 + -1;
  }
  else {
    if (pfFound != (int *)0x0) {
      *pfFound = 1;
    }
    p_local._4_4_ = *piVar3;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NamStrFindOrAddLim( Abc_Nam_t * p, char * pStr, char * pLim, int * pfFound )
{
    int iHandleNew;
    int *piPlace;
    char * pStore;
    assert( pStr < pLim );
    piPlace = Abc_NamStrHashFind( p, pStr, pLim );
    if ( *piPlace )
    {
        if ( pfFound )
            *pfFound = 1;
        return *piPlace;
    }
    if ( pfFound )
        *pfFound = 0;
    iHandleNew = p->iHandle + (pLim - pStr) + 1;
    while ( p->nStore < iHandleNew )
    {
        p->nStore *= 3;
        p->nStore /= 2;
        p->pStore  = ABC_REALLOC( char, p->pStore, p->nStore );
    }
    assert( p->nStore >= iHandleNew );
    // create new handle
    *piPlace = Vec_IntSize( &p->vInt2Handle );
    pStore = Abc_NamHandleToStr( p, p->iHandle );
    strncpy( pStore, pStr, pLim - pStr );
    pStore[pLim - pStr] = 0;
    Vec_IntPush( &p->vInt2Handle, p->iHandle );
    Vec_IntPush( &p->vInt2Next, 0 );
    p->iHandle = iHandleNew;
    // extend the hash table
    if ( Vec_IntSize(&p->vInt2Handle) > 2 * p->nBins )
        Abc_NamStrHashResize( p );
    return Vec_IntSize(&p->vInt2Handle) - 1;
}